

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidateOneNamespace(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_a0;
  PyObject *local_98;
  PyObject *local_90;
  PyObject *local_88;
  undefined8 local_80;
  xmlChar *value;
  PyObject *pyobj_ns;
  xmlNsPtr ns;
  xmlChar *prefix;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidateOneNamespace");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"OOOzOz:xmlValidateOneNamespace",&doc,&elem,&prefix,&ns,&value,
                       &local_80);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_88 = (PyObject *)0x0;
      }
      else {
        local_88 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_88;
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_90 = (PyObject *)0x0;
      }
      else {
        local_90 = (PyObject *)elem->name;
      }
      pyobj_doc = local_90;
      if (prefix == &_Py_NoneStruct) {
        local_98 = (PyObject *)0x0;
      }
      else {
        local_98 = *(PyObject **)(prefix + 0x10);
      }
      pyobj_elem = local_98;
      if (value == &_Py_NoneStruct) {
        local_a0 = (PyObject *)0x0;
      }
      else {
        local_a0 = *(PyObject **)(value + 0x10);
      }
      pyobj_ns = local_a0;
      ctxt._4_4_ = xmlValidateOneNamespace(local_88,local_90,local_98,ns,local_a0,local_80);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateOneNamespace(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * prefix;
    xmlNsPtr ns;
    PyObject *pyobj_ns;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidateOneNamespace") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOzOz:xmlValidateOneNamespace", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &prefix, &pyobj_ns, &value))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);
    ns = (xmlNsPtr) PyxmlNode_Get(pyobj_ns);

    c_retval = xmlValidateOneNamespace(ctxt, doc, elem, prefix, ns, value);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}